

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall
soul::StructuralParser::parseDotOperator(StructuralParser *this,Expression *expression)

{
  UnqualifiedName *name;
  TypeMetaFunction *elementType;
  Expression *pEVar1;
  DotOperator *expression_00;
  Op metaTypeOp;
  Context context;
  
  getContext(&context,this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b542);
  name = parseUnqualifiedName(this);
  metaTypeOp = getOpForTypeMetaFunctionName(name);
  if (metaTypeOp == none) {
    expression_00 =
         allocate<soul::AST::DotOperator,soul::AST::Context&,soul::AST::Expression&,soul::AST::UnqualifiedName&>
                   (this,&context,expression,name);
    pEVar1 = parseSuffixes(this,&expression_00->super_Expression);
  }
  else {
    elementType = allocate<soul::AST::TypeMetaFunction,soul::AST::Context&,soul::AST::Expression&,soul::AST::TypeMetaFunction::Op&>
                            (this,&(name->super_Expression).super_Statement.super_ASTObject.context,
                             expression,&metaTypeOp);
    pEVar1 = parseVectorOrArrayTypeSuffixes
                       (this,&elementType->super_Expression,metaFunctionArgument);
  }
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&context);
  return pEVar1;
}

Assistant:

AST::Expression& parseDotOperator (AST::Expression& expression)
    {
        auto context = getContext();
        expect (Operator::dot);
        auto& propertyOrMethodName = parseUnqualifiedName();

        auto metaTypeOp = getOpForTypeMetaFunctionName (propertyOrMethodName);

        if (metaTypeOp != AST::TypeMetaFunction::Op::none)
            return parseVectorOrArrayTypeSuffixes (allocate<AST::TypeMetaFunction> (propertyOrMethodName.context, expression, metaTypeOp),
                                                   ParseTypeContext::metaFunctionArgument);

        return parseSuffixes (allocate<AST::DotOperator> (context, expression, propertyOrMethodName));
    }